

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DualMappedPointerVector.hpp
# Opt level: O0

PublicationInfo * __thiscall
gmlc::containers::
DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
::find(DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
       *this,InterfaceHandle *searchValue2)

{
  bool bVar1;
  pointer pvVar2;
  vector<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>
  *in_RDI;
  const_iterator fnd;
  unordered_map<helics::InterfaceHandle,_unsigned_long,_std::hash<helics::InterfaceHandle>,_std::equal_to<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>_>
  *in_stack_ffffffffffffffc8;
  _Node_iterator_base<std::pair<const_helics::InterfaceHandle,_unsigned_long>,_false> local_28;
  _Node_iterator_base<std::pair<const_helics::InterfaceHandle,_unsigned_long>,_false> local_20 [3];
  pointer local_8;
  
  local_20[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<helics::InterfaceHandle,_unsigned_long,_std::hash<helics::InterfaceHandle>,_std::equal_to<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>_>
       ::find(in_stack_ffffffffffffffc8,(key_type *)0x5d7706);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<helics::InterfaceHandle,_unsigned_long,_std::hash<helics::InterfaceHandle>,_std::equal_to<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>_>
       ::end(in_stack_ffffffffffffffc8);
  bVar1 = std::__detail::operator==(local_20,&local_28);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_8 = (pointer)0x0;
  }
  else {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_helics::InterfaceHandle,_unsigned_long>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<const_helics::InterfaceHandle,_unsigned_long>,_false,_false>
                           *)0x5d773f);
    std::
    vector<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>
    ::operator[](in_RDI,pvVar2->second);
    local_8 = std::
              unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>::
              get((unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
                   *)in_RDI);
  }
  return local_8;
}

Assistant:

VType* find(const searchType2& searchValue2) const
        {
            auto fnd = lookup2.find(searchValue2);
            if (fnd != lookup2.end()) {
                return dataStorage[fnd->second].get();
            }
            return nullptr;
        }